

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *input)

{
  cmOutputConverter *this_00;
  string_view source;
  OutputFormat local_24;
  OutputFormat shellFormat;
  string *input_local;
  cmLinkLineComputer *this_local;
  
  local_24 = SHELL;
  if ((this->ForResponse & 1U) == 0) {
    if ((this->UseWatcomQuote & 1U) == 0) {
      if ((this->UseNinjaMulti & 1U) != 0) {
        local_24 = NINJAMULTI;
      }
    }
    else {
      local_24 = WATCOMQUOTE;
    }
  }
  else {
    local_24 = RESPONSE;
  }
  this_00 = this->OutputConverter;
  source = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (__return_storage_ptr__,this_00,source,local_24);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToOutputFormat(std::string const& input)
{
  cmOutputConverter::OutputFormat shellFormat = cmOutputConverter::SHELL;
  if (this->ForResponse) {
    shellFormat = cmOutputConverter::RESPONSE;
  } else if (this->UseWatcomQuote) {
    shellFormat = cmOutputConverter::WATCOMQUOTE;
  } else if (this->UseNinjaMulti) {
    shellFormat = cmOutputConverter::NINJAMULTI;
  }

  return this->OutputConverter->ConvertToOutputFormat(input, shellFormat);
}